

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_parse_input(mpc_input_t *i,mpc_parser_t *p,mpc_result_t *r)

{
  mpc_parser_t *i_00;
  mpc_err_t *pmVar1;
  void *pvVar2;
  long local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  mpc_err_t *local_30;
  mpc_err_t *e;
  mpc_result_t *pmStack_20;
  int x;
  mpc_result_t *r_local;
  mpc_parser_t *p_local;
  mpc_input_t *i_local;
  
  pmStack_20 = r;
  r_local = (mpc_result_t *)p;
  p_local = (mpc_parser_t *)i;
  pmVar1 = mpc_err_fail(i,"Unknown Error");
  local_30 = pmVar1;
  mpc_state_invalid();
  (pmVar1->state).pos = local_50;
  (pmVar1->state).row = local_48;
  (pmVar1->state).col = local_40;
  *(undefined8 *)&(pmVar1->state).term = local_38;
  e._4_4_ = mpc_parse_run((mpc_input_t *)p_local,(mpc_parser_t *)r_local,pmStack_20,&local_30,0);
  i_00 = p_local;
  if (e._4_4_ == 0) {
    pmVar1 = mpc_err_merge((mpc_input_t *)p_local,local_30,pmStack_20->error);
    pmVar1 = mpc_err_export((mpc_input_t *)i_00,pmVar1);
    pmStack_20->error = pmVar1;
  }
  else {
    mpc_err_delete_internal((mpc_input_t *)p_local,local_30);
    pvVar2 = mpc_export((mpc_input_t *)p_local,pmStack_20->output);
    pmStack_20->output = pvVar2;
  }
  return e._4_4_;
}

Assistant:

int mpc_parse_input(mpc_input_t *i, mpc_parser_t *p, mpc_result_t *r) {
  int x;
  mpc_err_t *e = mpc_err_fail(i, "Unknown Error");
  e->state = mpc_state_invalid();
  x = mpc_parse_run(i, p, r, &e, 0);
  if (x) {
    mpc_err_delete_internal(i, e);
    r->output = mpc_export(i, r->output);
  } else {
    r->error = mpc_err_export(i, mpc_err_merge(i, e, r->error));
  }
  return x;
}